

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O2

void __thiscall duckdb::ColumnData::MergeStatistics(ColumnData *this,BaseStatistics *other)

{
  BaseStatistics *this_00;
  InternalException *this_01;
  allocator local_41;
  string local_40;
  
  if ((this->stats).
      super_unique_ptr<duckdb::SegmentStatistics,_std::default_delete<duckdb::SegmentStatistics>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::SegmentStatistics,_std::default_delete<duckdb::SegmentStatistics>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::SegmentStatistics_*,_std::default_delete<duckdb::SegmentStatistics>_>
      .super__Head_base<0UL,_duckdb::SegmentStatistics_*,_false>._M_head_impl !=
      (SegmentStatistics *)0x0) {
    ::std::mutex::lock(&this->stats_lock);
    this_00 = &unique_ptr<duckdb::SegmentStatistics,_std::default_delete<duckdb::SegmentStatistics>,_true>
               ::operator->(&this->stats)->statistics;
    BaseStatistics::Merge(this_00,other);
    pthread_mutex_unlock((pthread_mutex_t *)&this->stats_lock);
    return;
  }
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_40,"ColumnData::MergeStatistics called on a column without stats",
             &local_41);
  InternalException::InternalException(this_01,&local_40);
  __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ColumnData::MergeStatistics(const BaseStatistics &other) {
	if (!stats) {
		throw InternalException("ColumnData::MergeStatistics called on a column without stats");
	}
	lock_guard<mutex> l(stats_lock);
	return stats->statistics.Merge(other);
}